

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O2

void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *pNtk)

{
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pInit;
  Abc_Obj_t *pAVar2;
  int i;
  int iVar3;
  
  p = Vec_PtrAlloc(100);
  p_00 = Vec_PtrAlloc(100);
  pNtk_00 = pManMR->pInitNtk;
  iVar3 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar3) {
      iVar3 = 0;
      do {
        if (pNtk_00->vPis->nSize <= iVar3) {
          iVar3 = 0;
          do {
            if (pNtk->vBoxes->nSize <= iVar3) {
              iVar3 = p->nSize;
              i = 0;
              if (iVar3 < 1) {
                iVar3 = 0;
                i = 0;
              }
              for (; iVar3 != i; i = i + 1) {
                pAVar1 = (Abc_Obj_t *)Vec_PtrEntry(p,i);
                Abc_FlowRetime_UpdateBackwardInit_rec(pAVar1);
              }
              for (iVar3 = 0; iVar3 < pNtk->vObjs->nSize; iVar3 = iVar3 + 1) {
                pAVar1 = Abc_NtkObj(pNtk,iVar3);
                if (pAVar1 != (Abc_Obj_t *)0x0) {
                  pAVar1->field_0x14 = pAVar1->field_0x14 & 0xcf;
                }
              }
              Vec_PtrFree(p);
              Vec_PtrFree(p_00);
              return;
            }
            pAVar1 = Abc_NtkBox(pNtk,iVar3);
            if ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8) {
              if (p_00->nSize < 1) {
                __assert_fail("Vec_PtrSize(vPi) > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fret/fretInit.c"
                              ,0x2bd,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
              }
              pAVar2 = (Abc_Obj_t *)Vec_PtrPop(p_00);
              pAVar1->field_0x14 = pAVar1->field_0x14 | 0x30;
              pManMR->pDataArray[(uint)pAVar1->Id].field_1.pred = pAVar2;
              (pAVar1->field_5).pData = pAVar2;
            }
            iVar3 = iVar3 + 1;
          } while( true );
        }
        pAVar1 = Abc_NtkPi(pNtk_00,iVar3);
        iVar3 = iVar3 + 1;
      } while ((pAVar1->vFanouts).nSize == 0);
      __assert_fail("Abc_ObjFanoutNum( pInitObj ) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fret/fretInit.c"
                    ,0x2b8,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
    }
    pAVar1 = Abc_NtkObj(pNtk,iVar3);
    if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 5)) {
      pAVar2 = pManMR->pDataArray[(uint)pAVar1->Id].field_1.pred;
      if ((*(uint *)&pAVar2->field_0x14 & 0xf) != 2) {
        __assert_fail("Abc_ObjIsPi(pInitObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fret/fretInit.c"
                      ,0x2a5,"void Abc_FlowRetime_UpdateBackwardInit(Abc_Ntk_t *)");
      }
      pInit = Abc_NtkCreateNodeBuf(pNtk_00,(Abc_Obj_t *)0x0);
      Abc_FlowRetime_ClearInitToOrig(pInit);
      Abc_ObjBetterTransferFanout(pAVar2,pInit,0);
      pManMR->pDataArray[(uint)pAVar1->Id].field_1.pred = pInit;
      pAVar1->field_0x14 = pAVar1->field_0x14 | 0x10;
      Vec_PtrPush(p,pAVar1);
      Vec_PtrPush(p_00,pAVar2);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Abc_FlowRetime_UpdateBackwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pOrigObj,  *pInitObj;
  Vec_Ptr_t *vBo = Vec_PtrAlloc(100);
  Vec_Ptr_t *vPi = Vec_PtrAlloc(100);
  Abc_Ntk_t *pInitNtk = pManMR-> pInitNtk;
  Abc_Obj_t *pBuf;
  int i;

  // remove PIs from network (from BOs)
  Abc_NtkForEachObj( pNtk, pOrigObj, i )
    if (Abc_ObjIsBo(pOrigObj)) {
      pInitObj = FDATA(pOrigObj)->pInitObj;
      assert(Abc_ObjIsPi(pInitObj));

      // DEBUG
      // printf("update : freeing PI %d\n", pInitObj->Id);
      
      // create a buffer instead
      pBuf = Abc_NtkCreateNodeBuf( pInitNtk, NULL );
      Abc_FlowRetime_ClearInitToOrig( pBuf );

      Abc_ObjBetterTransferFanout( pInitObj, pBuf, 0 );
      FDATA(pOrigObj)->pInitObj = pBuf;
      pOrigObj->fMarkA = 1;

      Vec_PtrPush(vBo, pOrigObj);
      Vec_PtrPush(vPi, pInitObj);
    }
  
  // check that PIs are all free
  Abc_NtkForEachPi( pInitNtk, pInitObj, i) {
    assert( Abc_ObjFanoutNum( pInitObj ) == 0);
  }

  // add PIs to to latches
  Abc_NtkForEachLatch( pNtk, pOrigObj, i ) {
    assert(Vec_PtrSize(vPi) > 0);
    pInitObj = (Abc_Obj_t*)Vec_PtrPop(vPi);

    // DEBUG
    // printf("update : mapping latch %d to PI %d\n", pOrigObj->Id, pInitObj->Id);

    pOrigObj->fMarkA = pOrigObj->fMarkB = 1;
    FDATA(pOrigObj)->pInitObj = pInitObj;
    Abc_ObjSetData(pOrigObj, pInitObj);
  }  

  // recursively build init network
  Vec_PtrForEachEntry( Abc_Obj_t *, vBo, pOrigObj, i )
    Abc_FlowRetime_UpdateBackwardInit_rec( pOrigObj );
  
  // clear flags
  Abc_NtkForEachObj( pNtk, pOrigObj, i )
    pOrigObj->fMarkA = pOrigObj->fMarkB = 0;

  // deallocate
  Vec_PtrFree( vBo );
  Vec_PtrFree( vPi );
}